

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::binary_op_atan2>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  Mat *pMVar4;
  Mat *extraout_RAX;
  long lVar5;
  long lVar6;
  uint uVar7;
  Mat *pMVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  binary_op_atan2 op;
  binary_op_atan2 local_59;
  Mat *local_58;
  Mat *local_50;
  Mat *local_48;
  Mat *local_40;
  Mat *local_38;
  
  uVar7 = a->h * a->w * a->d;
  local_38 = (Mat *)0x0;
  pMVar8 = (Mat *)(ulong)uVar7;
  if ((int)uVar7 < 1) {
    pMVar8 = local_38;
  }
  pMVar4 = (Mat *)(ulong)(uint)a->c;
  if (a->c < 1) {
    pMVar4 = local_38;
  }
  local_58 = a;
  local_50 = b;
  local_48 = c;
  local_40 = pMVar4;
  for (; local_38 != local_40; local_38 = (Mat *)((long)&local_38->data + 1)) {
    lVar5 = local_48->cstep * local_48->elemsize * (long)local_38;
    pvVar1 = local_48->data;
    lVar10 = local_50->cstep * local_50->elemsize * (long)local_38;
    pvVar2 = local_50->data;
    lVar9 = local_58->cstep * local_58->elemsize * (long)local_38;
    pvVar3 = local_58->data;
    pMVar4 = local_50;
    for (lVar6 = 0; (long)pMVar8 * 4 != lVar6; lVar6 = lVar6 + 4) {
      fVar11 = binary_op_atan2::operator()
                         (&local_59,(float *)((long)pvVar3 + lVar6 + lVar9),
                          (float *)((long)pvVar2 + lVar6 + lVar10));
      *(float *)((long)pvVar1 + lVar6 + lVar5) = fVar11;
      pMVar4 = extraout_RAX;
    }
  }
  return (int)pMVar4;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int channels = a.c;
    int size = a.w * a.h * a.d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = op(ptr[i], ptr1[i]);
        }
    }

    return 0;
}